

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_output_basic(connectdata *conn,_Bool proxy)

{
  Curl_easy *data_00;
  char *__s;
  size_t insize;
  char *pcVar1;
  char *out;
  char *pcStack_50;
  CURLcode result;
  char *pwd;
  char *user;
  char **userp;
  Curl_easy *data;
  char *authorization;
  size_t size;
  connectdata *pcStack_18;
  _Bool proxy_local;
  connectdata *conn_local;
  
  authorization = (char *)0x0;
  data = (Curl_easy *)0x0;
  data_00 = conn->data;
  if (proxy) {
    user = (char *)&conn->allocptr;
    pwd = (conn->http_proxy).user;
    pcStack_50 = (conn->http_proxy).passwd;
  }
  else {
    user = (char *)&(conn->allocptr).userpwd;
    pwd = conn->user;
    pcStack_50 = conn->passwd;
  }
  size._7_1_ = proxy;
  pcStack_18 = conn;
  __s = curl_maprintf("%s:%s",pwd,pcStack_50);
  if (__s == (char *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    insize = strlen(__s);
    out._4_4_ = Curl_base64_encode(data_00,__s,insize,(char **)&data,(size_t *)&authorization);
    if (out._4_4_ == CURLE_OK) {
      if (data == (Curl_easy *)0x0) {
        out._4_4_ = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        (*Curl_cfree)(*(void **)user);
        pcVar1 = "";
        if ((size._7_1_ & 1) != 0) {
          pcVar1 = "Proxy-";
        }
        pcVar1 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar1,data);
        *(char **)user = pcVar1;
        (*Curl_cfree)(data);
        if (*(long *)user == 0) {
          out._4_4_ = CURLE_OUT_OF_MEMORY;
        }
      }
    }
    (*Curl_cfree)(__s);
    conn_local._4_4_ = out._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode http_output_basic(struct connectdata *conn, bool proxy)
{
  size_t size = 0;
  char *authorization = NULL;
  struct Curl_easy *data = conn->data;
  char **userp;
  const char *user;
  const char *pwd;
  CURLcode result;
  char *out;

  if(proxy) {
    userp = &conn->allocptr.proxyuserpwd;
    user = conn->http_proxy.user;
    pwd = conn->http_proxy.passwd;
  }
  else {
    userp = &conn->allocptr.userpwd;
    user = conn->user;
    pwd = conn->passwd;
  }

  out = aprintf("%s:%s", user, pwd);
  if(!out)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_base64_encode(data, out, strlen(out), &authorization, &size);
  if(result)
    goto fail;

  if(!authorization) {
    result = CURLE_REMOTE_ACCESS_DENIED;
    goto fail;
  }

  free(*userp);
  *userp = aprintf("%sAuthorization: Basic %s\r\n",
                   proxy ? "Proxy-" : "",
                   authorization);
  free(authorization);
  if(!*userp) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  fail:
  free(out);
  return result;
}